

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Extractor::input(Extractor *this,int blob_index,Mat *in)

{
  pointer pMVar1;
  int *piVar2;
  Allocator *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  Mat *pMVar9;
  
  iVar8 = -1;
  if (-1 < blob_index) {
    pMVar1 = (this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pMVar1;
    if (blob_index < (int)(lVar7 / 0x48)) {
      pMVar9 = pMVar1 + (uint)blob_index;
      iVar8 = 0;
      if (pMVar9 != in) {
        piVar2 = in->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar9->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pAVar3 = pMVar9->allocator;
            if (pAVar3 == (Allocator *)0x0) {
              free(pMVar9->data);
            }
            else {
              (*pAVar3->_vptr_Allocator[3])(pAVar3,pMVar9->data,lVar7 % 0x48);
            }
          }
        }
        pMVar9->cstep = 0;
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
        pMVar9->c = 0;
        pMVar9->dims = 0;
        pMVar9->w = 0;
        pMVar9->h = 0;
        pMVar9->d = 0;
        piVar2 = in->refcount;
        pMVar9->data = in->data;
        pMVar9->refcount = piVar2;
        pMVar9->elemsize = in->elemsize;
        pMVar9->elempack = in->elempack;
        pMVar9->allocator = in->allocator;
        iVar4 = in->w;
        iVar5 = in->h;
        iVar6 = in->d;
        pMVar9->dims = in->dims;
        pMVar9->w = iVar4;
        pMVar9->h = iVar5;
        pMVar9->d = iVar6;
        pMVar9->c = in->c;
        pMVar9->cstep = in->cstep;
      }
    }
  }
  return iVar8;
}

Assistant:

int Extractor::input(int blob_index, const Mat& in)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    d->blob_mats[blob_index] = in;

    return 0;
}